

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  size_type sVar1;
  __type _Var2;
  __type _Var3;
  allocator local_6d1;
  string local_6d0 [32];
  undefined1 local_6b0 [8];
  PathCompleteGraphsBenchmark pathCompleteGraphsBenchmark;
  string local_5b0 [32];
  undefined1 local_590 [8];
  RandomGraphBenchmark randomGraphBenchmark;
  string local_4c0 [32];
  undefined1 local_4a0 [8];
  TreeBenchmark treeBenchmark;
  string local_3d0 [32];
  undefined1 local_3b0 [8];
  PathBenchmark pathBenchmark;
  string local_2e0 [39];
  allocator local_2b9;
  string local_2b8 [32];
  undefined1 local_298 [8];
  DynamicGraphTest graphTest;
  ActionTest actionTest;
  allocator local_d9;
  string local_d8 [32];
  variables_map local_b8 [8];
  variables_map args;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_a8 [144];
  char **local_18;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_18 = argv;
  argv_local._0_4_ = argc;
  parseArguments((int)local_b8,(char **)(ulong)(uint)argc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"test",&local_d9);
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_a8,(key_type *)local_d8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  if (sVar1 != 0) {
    ActionTest::ActionTest((ActionTest *)&graphTest.G.halt);
    DynamicGraphTest::DynamicGraphTest((DynamicGraphTest *)local_298);
    ActionTest::run((ActionTest *)&graphTest.G.halt);
    DynamicGraphTest::run((DynamicGraphTest *)local_298);
    DynamicGraphTest::~DynamicGraphTest((DynamicGraphTest *)local_298);
    ActionTest::~ActionTest((ActionTest *)&graphTest.G.halt);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b8,"benchmark",&local_2b9);
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_a8,(key_type *)local_2b8);
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  if (sVar1 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_2e0,"path",(allocator *)&pathBenchmark.super_Benchmark.G.field_0xbf);
    sVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(local_a8,(key_type *)local_2e0);
    std::__cxx11::string::~string(local_2e0);
    std::allocator<char>::~allocator((allocator<char> *)&pathBenchmark.super_Benchmark.G.field_0xbf)
    ;
    if (sVar1 != 0) {
      PathBenchmark::PathBenchmark((PathBenchmark *)local_3b0,vertices);
      PathBenchmark::run((PathBenchmark *)local_3b0,deletions,queries);
      PathBenchmark::~PathBenchmark((PathBenchmark *)local_3b0);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_3d0,"tree",(allocator *)&treeBenchmark.super_Benchmark.G.field_0xbf);
    sVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(local_a8,(key_type *)local_3d0);
    std::__cxx11::string::~string(local_3d0);
    std::allocator<char>::~allocator((allocator<char> *)&treeBenchmark.super_Benchmark.G.field_0xbf)
    ;
    if (sVar1 != 0) {
      TreeBenchmark::TreeBenchmark((TreeBenchmark *)local_4a0,vertices);
      TreeBenchmark::run((TreeBenchmark *)local_4a0,deletions,queries);
      TreeBenchmark::~TreeBenchmark((TreeBenchmark *)local_4a0);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_4c0,"random",(allocator *)&randomGraphBenchmark.super_Benchmark.G.field_0xbf);
    sVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(local_a8,(key_type *)local_4c0);
    std::__cxx11::string::~string(local_4c0);
    std::allocator<char>::~allocator
              ((allocator<char> *)&randomGraphBenchmark.super_Benchmark.G.field_0xbf);
    if (sVar1 != 0) {
      RandomGraphBenchmark::RandomGraphBenchmark((RandomGraphBenchmark *)local_590,vertices,edges);
      RandomGraphBenchmark::run((RandomGraphBenchmark *)local_590,deletions,queries);
      RandomGraphBenchmark::~RandomGraphBenchmark((RandomGraphBenchmark *)local_590);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_5b0,"path-complete",
               (allocator *)
               ((long)&pathCompleteGraphsBenchmark.deletionSet._M_t._M_impl.super__Rb_tree_header.
                       _M_node_count + 7));
    sVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(local_a8,(key_type *)local_5b0);
    std::__cxx11::string::~string(local_5b0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&pathCompleteGraphsBenchmark.deletionSet._M_t._M_impl.super__Rb_tree_header.
                       _M_node_count + 7));
    if (sVar1 != 0) {
      _Var2 = std::sqrt<unsigned_long>(vertices);
      _Var3 = std::sqrt<unsigned_long>(vertices);
      PathCompleteGraphsBenchmark::PathCompleteGraphsBenchmark
                ((PathCompleteGraphsBenchmark *)local_6b0,(int)_Var2,(int)_Var3);
      PathCompleteGraphsBenchmark::run((PathCompleteGraphsBenchmark *)local_6b0,deletions,queries);
      PathCompleteGraphsBenchmark::~PathCompleteGraphsBenchmark
                ((PathCompleteGraphsBenchmark *)local_6b0);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6d0,"example",&local_6d1);
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_a8,(key_type *)local_6d0);
  std::__cxx11::string::~string(local_6d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d1);
  if (sVar1 != 0) {
    runExample();
  }
  argv_local._4_4_ = 0;
  boost::program_options::variables_map::~variables_map(local_b8);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
{
    boost::program_options::variables_map args = parseArguments(argc, argv);

    if (args.count("test")) {
        ActionTest actionTest;
        DynamicGraphTest graphTest;
        actionTest.run();
        graphTest.run();
    }
    if (args.count("benchmark")) {
        if (args.count("path")) {
            PathBenchmark pathBenchmark(vertices);
            pathBenchmark.run(deletions, queries);
        }
        if (args.count("tree")) {
            TreeBenchmark treeBenchmark(vertices);
            treeBenchmark.run(deletions, queries);
        }
        if (args.count("random")) {
            RandomGraphBenchmark randomGraphBenchmark(vertices, edges);
            randomGraphBenchmark.run(deletions, queries);
        }
        if (args.count("path-complete")) {
            PathCompleteGraphsBenchmark pathCompleteGraphsBenchmark(
                    static_cast<int>(sqrt(vertices)),
                    static_cast<int>(sqrt(vertices)));
            pathCompleteGraphsBenchmark.run(deletions, queries);
        }
    }
    if (args.count("example")) {
        runExample();
    }

    return 0;
}